

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktShaderBuiltinPrecisionTests.cpp
# Opt level: O1

PrecisionCase *
vkt::shaderexecutor::
createFuncCase<vkt::shaderexecutor::Signature<float,tcu::Vector<float,3>,tcu::Vector<float,3>,vkt::shaderexecutor::Void,vkt::shaderexecutor::Void>>
          (CaseContext *context,string *name,
          Func<vkt::shaderexecutor::Signature<float,_tcu::Vector<float,_3>,_tcu::Vector<float,_3>,_vkt::shaderexecutor::Void,_vkt::shaderexecutor::Void>_>
          *func)

{
  int iVar1;
  FuncCase<vkt::shaderexecutor::Signature<float,_tcu::Vector<float,_3>,_tcu::Vector<float,_3>,_vkt::shaderexecutor::Void,_vkt::shaderexecutor::Void>_>
  *this;
  
  iVar1 = (*(func->super_FuncBase)._vptr_FuncBase[5])(func);
  if (iVar1 == 1) {
    this = (FuncCase<vkt::shaderexecutor::Signature<float,_tcu::Vector<float,_3>,_tcu::Vector<float,_3>,_vkt::shaderexecutor::Void,_vkt::shaderexecutor::Void>_>
            *)operator_new(0x200);
    InOutFuncCase<vkt::shaderexecutor::Signature<float,_tcu::Vector<float,_3>,_tcu::Vector<float,_3>,_vkt::shaderexecutor::Void,_vkt::shaderexecutor::Void>_>
    ::InOutFuncCase((InOutFuncCase<vkt::shaderexecutor::Signature<float,_tcu::Vector<float,_3>,_tcu::Vector<float,_3>,_vkt::shaderexecutor::Void,_vkt::shaderexecutor::Void>_>
                     *)this,context,name,func);
  }
  else if (iVar1 == -1) {
    this = (FuncCase<vkt::shaderexecutor::Signature<float,_tcu::Vector<float,_3>,_tcu::Vector<float,_3>,_vkt::shaderexecutor::Void,_vkt::shaderexecutor::Void>_>
            *)operator_new(0x200);
    FuncCase<vkt::shaderexecutor::Signature<float,_tcu::Vector<float,_3>,_tcu::Vector<float,_3>,_vkt::shaderexecutor::Void,_vkt::shaderexecutor::Void>_>
    ::FuncCase(this,context,name,func);
  }
  else {
    this = (FuncCase<vkt::shaderexecutor::Signature<float,_tcu::Vector<float,_3>,_tcu::Vector<float,_3>,_vkt::shaderexecutor::Void,_vkt::shaderexecutor::Void>_>
            *)0x0;
  }
  return (PrecisionCase *)this;
}

Assistant:

PrecisionCase* createFuncCase (const CaseContext& context, const string& name, const Func<Sig>&	func)
{
	switch (func.getOutParamIndex())
	{
		case -1:
			return new FuncCase<Sig>(context, name, func);
		case 1:
			return new InOutFuncCase<Sig>(context, name, func);
		default:
			DE_FATAL("Impossible");
	}
	return DE_NULL;
}